

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O1

int av1_index_color_cache
              (uint16_t *color_cache,int n_cache,uint16_t *colors,int n_colors,
              uint8_t *cache_color_found,int *out_cache_colors)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int in_cache_flags [8];
  int local_58 [10];
  
  if (n_cache < 1) {
    iVar5 = n_colors;
    if (0 < n_colors) {
      uVar1 = 0;
      do {
        out_cache_colors[uVar1] = (uint)colors[uVar1];
        uVar1 = uVar1 + 1;
      } while ((uint)n_colors != uVar1);
    }
  }
  else {
    iVar5 = 0;
    memset(cache_color_found,0,(ulong)(uint)n_cache);
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    if (0 < n_colors) {
      uVar1 = 0;
      iVar2 = 0;
      do {
        uVar4 = 0;
        do {
          if (colors[uVar4] == color_cache[uVar1]) {
            local_58[uVar4] = 1;
            cache_color_found[uVar1] = '\x01';
            iVar2 = iVar2 + 1;
            break;
          }
          uVar4 = uVar4 + 1;
        } while ((uint)n_colors != uVar4);
        uVar1 = uVar1 + 1;
      } while ((uVar1 < (uint)n_cache) && (iVar2 < n_colors));
    }
    if (0 < n_colors) {
      uVar1 = 0;
      iVar5 = 0;
      do {
        if (local_58[uVar1] == 0) {
          lVar3 = (long)iVar5;
          iVar5 = iVar5 + 1;
          out_cache_colors[lVar3] = (uint)colors[uVar1];
        }
        uVar1 = uVar1 + 1;
      } while ((uint)n_colors != uVar1);
    }
  }
  return iVar5;
}

Assistant:

int av1_index_color_cache(const uint16_t *color_cache, int n_cache,
                          const uint16_t *colors, int n_colors,
                          uint8_t *cache_color_found, int *out_cache_colors) {
  if (n_cache <= 0) {
    for (int i = 0; i < n_colors; ++i) out_cache_colors[i] = colors[i];
    return n_colors;
  }
  memset(cache_color_found, 0, n_cache * sizeof(*cache_color_found));
  int n_in_cache = 0;
  int in_cache_flags[PALETTE_MAX_SIZE];
  memset(in_cache_flags, 0, sizeof(in_cache_flags));
  for (int i = 0; i < n_cache && n_in_cache < n_colors; ++i) {
    for (int j = 0; j < n_colors; ++j) {
      if (colors[j] == color_cache[i]) {
        in_cache_flags[j] = 1;
        cache_color_found[i] = 1;
        ++n_in_cache;
        break;
      }
    }
  }
  int j = 0;
  for (int i = 0; i < n_colors; ++i)
    if (!in_cache_flags[i]) out_cache_colors[j++] = colors[i];
  assert(j == n_colors - n_in_cache);
  return j;
}